

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O0

void __thiscall
re::fft::simd_fft<float,_256L>::stage0
          (simd_fft<float,_256L> *this,span<std::complex<float>,_256L> out)

{
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  element_type t;
  uint i;
  reference in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint local_14;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 2) {
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)in_stack_ffffffffffffffb0,
               (index_type)in_stack_ffffffffffffffa8);
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)in_stack_ffffffffffffffb0,
               (index_type)in_stack_ffffffffffffffa8);
    std::operator-(in_stack_ffffffffffffffa8,(complex<float> *)0x10cbe2);
    uVar1 = extraout_XMM0_Da;
    uVar2 = extraout_XMM0_Db;
    uVar3 = extraout_XMM0_Dc;
    uVar4 = extraout_XMM0_Dd;
    in_stack_ffffffffffffffb0 =
         gsl::span<std::complex<float>,_256L>::operator[]
                   ((span<std::complex<float>,_256L> *)in_stack_ffffffffffffffb0,
                    (index_type)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0->_M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    in_stack_ffffffffffffffa8 =
         gsl::span<std::complex<float>,_256L>::operator[]
                   ((span<std::complex<float>,_256L> *)in_stack_ffffffffffffffb0,
                    (index_type)in_stack_ffffffffffffffa8);
    std::complex<float>::operator+=
              ((complex<float> *)CONCAT44(uVar4,uVar3),(complex<float> *)CONCAT44(uVar2,uVar1));
  }
  return;
}

Assistant:

void stage0(gsl::span<cpx_t, N> out) const noexcept {
        for (auto i = 0u; i < N; i += 2) {
            auto t = out[i + 1];
            out[i + 1] = out[i] - t;
            out[i] += t;
        }
    }